

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boids.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2542f::BoidsPlugIn::handleFunctionKeys(BoidsPlugIn *this,int keyNumber)

{
  undefined4 in_ESI;
  BoidsPlugIn *unaff_retaddr;
  BoidsPlugIn *in_stack_00000030;
  BoidsPlugIn *in_stack_00000080;
  undefined4 in_stack_fffffffffffffff0;
  
  switch(in_ESI) {
  case 1:
    addBoidToFlock(unaff_retaddr);
    break;
  case 2:
    removeBoidFromFlock((BoidsPlugIn *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
    break;
  case 3:
    nextPD(in_stack_00000080);
    break;
  case 4:
    nextBoundaryCondition((BoidsPlugIn *)0x122f9c);
    break;
  case 5:
    printLQbinStats(in_stack_00000030);
  }
  return;
}

Assistant:

void handleFunctionKeys (int keyNumber)
        {
            switch (keyNumber)
            {
            case 1:  addBoidToFlock ();         break;
            case 2:  removeBoidFromFlock ();    break;
            case 3:  nextPD ();                 break;
            case 4:  nextBoundaryCondition ();  break;
            case 5:  printLQbinStats ();        break;
            }
        }